

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::
     WriteConstantDelta(int constant,uint frame_of_reference,idx_t count,uint *values,bool *validity
                       ,void *data_ptr)

{
  uint *puVar1;
  
  ReserveSpace((BitpackingCompressionState<unsigned_int,_true,_int> *)data_ptr,8);
  WriteMetaData((BitpackingCompressionState<unsigned_int,_true,_int> *)data_ptr,CONSTANT_DELTA);
  puVar1 = *(uint **)((long)data_ptr + 0x40);
  *puVar1 = frame_of_reference;
  puVar1[1] = constant;
  *(uint **)((long)data_ptr + 0x40) = puVar1 + 2;
  UpdateStats((BitpackingCompressionState<unsigned_int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}